

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Runner2::openStream(Runner2 *this)

{
  ostream *poVar1;
  domain_error *this_00;
  ConfigData *pCVar2;
  string local_1b0 [32];
  ostringstream oss;
  
  pCVar2 = this->m_config;
  if ((pCVar2->stream)._M_string_length != 0) {
    Config::useStream(this->m_configWrapper,&pCVar2->stream);
    pCVar2 = this->m_config;
  }
  if ((pCVar2->outputFilename)._M_string_length != 0) {
    std::ofstream::open((char *)&this->m_ofs,
                        (_Ios_Openmode)(pCVar2->outputFilename)._M_dataplus._M_p);
    if (((&this->field_0x30)[*(long *)(*(long *)&this->m_ofs + -0x18)] & 5) == 0) {
      Config::setStreamBuf(this->m_configWrapper,(streambuf *)&this->field_0x18);
      return;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    poVar1 = std::operator<<((ostream *)&oss,"Unable to open file: \'");
    poVar1 = std::operator<<(poVar1,(string *)&this->m_config->outputFilename);
    std::operator<<(poVar1,"\'");
    this_00 = (domain_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::domain_error::domain_error(this_00,local_1b0);
    __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
  }
  return;
}

Assistant:

void openStream() {
            if( !m_config.stream.empty() )
                m_configWrapper.useStream( m_config.stream );

            // Open output file, if specified
            if( !m_config.outputFilename.empty() ) {
                m_ofs.open( m_config.outputFilename.c_str() );
                if( m_ofs.fail() ) {
                    std::ostringstream oss;
                    oss << "Unable to open file: '" << m_config.outputFilename << "'";
                    throw std::domain_error( oss.str() );
                }
                m_configWrapper.setStreamBuf( m_ofs.rdbuf() );
            }
        }